

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O1

const_iterator __thiscall
iffl::
flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
::end(flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      *this)

{
  ulong *puVar1;
  pointer_type pcVar2;
  ulong uVar3;
  buffer_t<char> *in_RSI;
  
  buffer_t<char>::validate(in_RSI);
  puVar1 = (ulong *)in_RSI->last;
  if (puVar1 == (ulong *)0x0) {
    (this->buffer_).begin = (pointer_type)0x0;
    pcVar2 = (pointer_type)0x0;
  }
  else {
    uVar3 = *puVar1;
    if (uVar3 == 0) {
      uVar3 = puVar1[2] + 0x1f & 0xfffffffffffffff8;
    }
    pcVar2 = (pointer_type)((long)puVar1 + uVar3);
  }
  (this->buffer_).begin = pcVar2;
  return (const_iterator)(buffer_char_pointer)this;
}

Assistant:

const_iterator end() const noexcept {
        validate_pointer_invariants();
        if (buff().last) {
            if (traits_traits::has_next_offset_v) {
                size_type const next_offset{ traits_traits::get_next_offset(buff().last) };
                if (next_offset) {
                    return const_iterator{ buff().last + next_offset };
                } else {
                    size_with_padding_t const last_element_size{ traits_traits::get_size(buff().last) };
                    return const_iterator{ buff().last + last_element_size.size_padded() };
                }
            } else {
                size_with_padding_t const last_element_size{ traits_traits::get_size(buff().last) };
                return const_iterator{ buff().last + last_element_size.size_padded() };
            }
        } else {
            return const_iterator{ };
        }
    }